

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void traverse_hplane_fast_rowmajor<float,long>
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane,ExtIsoForest *model_outputs,
               float *row_numeric_data,double *output_depth,long *tree_num,double *tree_depth,
               size_t row)

{
  float fVar1;
  double dVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  double *in_RCX;
  long in_RDX;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_RDI;
  long in_R8;
  double *in_R9;
  long in_stack_00000008;
  size_t col;
  double hval;
  size_t curr_lev;
  size_t local_78;
  ulong local_48;
  double local_40;
  size_type local_38;
  
  local_38 = 0;
  while( true ) {
    pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    if (pvVar3->hplane_left == 0) break;
    local_40 = 0.0;
    local_48 = 0;
    while( true ) {
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar3->col_num);
      if (sVar4 <= local_48) break;
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&pvVar3->col_num,local_48);
      fVar1 = *(float *)(in_RDX + *pvVar5 * 4);
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->mean,local_48);
      dVar2 = *pvVar6;
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->coef,local_48);
      local_40 = ((double)fVar1 - dVar2) * *pvVar6 + local_40;
      local_48 = local_48 + 1;
    }
    pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    if (pvVar3->split_point < local_40) {
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      local_78 = pvVar3->hplane_right;
    }
    else {
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      local_78 = pvVar3->hplane_left;
    }
    local_38 = local_78;
  }
  pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
  *in_RCX = pvVar3->score + *in_RCX;
  if (in_R8 != 0) {
    *(size_type *)(in_R8 + in_stack_00000008 * 8) = local_38;
  }
  if (in_R9 != (double *)0x0) {
    pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    *in_R9 = pvVar3->score;
  }
  return;
}

Assistant:

void traverse_hplane_fast_rowmajor(std::vector<IsoHPlane>  &hplane,
                                   ExtIsoForest            &model_outputs,
                                   real_t *restrict        row_numeric_data,
                                   double &restrict        output_depth,
                                   sparse_ix *restrict     tree_num,
                                   double *restrict        tree_depth,
                                   size_t                  row) noexcept
{
    size_t  curr_lev = 0;
    double  hval;

    while(true)
    {
        // if (hplane[curr_lev].score > 0)
        if (unlikely(hplane[curr_lev].hplane_left == 0))
        {
            output_depth += hplane[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = hplane[curr_lev].score;
            return;
        }

        else
        {
            hval = 0;
            for (size_t col = 0; col < hplane[curr_lev].col_num.size(); col++)
                hval += (row_numeric_data[hplane[curr_lev].col_num[col]] 
                         - hplane[curr_lev].mean[col]) * hplane[curr_lev].coef[col];

            curr_lev  = (hval <= hplane[curr_lev].split_point)?
                         hplane[curr_lev].hplane_left : hplane[curr_lev].hplane_right;

        }
    }
}